

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

void __thiscall Json::StyledStreamWriter::~StyledStreamWriter(StyledStreamWriter *this)

{
  StyledStreamWriter *this_local;
  
  std::__cxx11::string::~string((string *)&this->indentation_);
  std::__cxx11::string::~string((string *)&this->indentString_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->childValues_);
  return;
}

Assistant:

~StyledStreamWriter() = default;